

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResultCollector.cpp
# Opt level: O2

void __thiscall
tcu::ResultCollector::ResultCollector(ResultCollector *this,TestLog *log,string *prefix)

{
  allocator<char> local_11;
  
  this->m_log = log;
  std::__cxx11::string::string((string *)&this->m_prefix,(string *)prefix);
  this->m_result = QP_TEST_RESULT_LAST;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_message,"Pass",&local_11);
  return;
}

Assistant:

ResultCollector::ResultCollector (TestLog& log, const std::string& prefix)
	: m_log		(&log)
	, m_prefix	(prefix)
	, m_result	(QP_TEST_RESULT_LAST)
	, m_message ("Pass")
{
}